

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::batch_normalize
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  tensor *item;
  resizable_tensor *this;
  resizable_tensor *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
  *in_RDX;
  resizable_tensor *in_RSI;
  long *in_RDI;
  long *in_R8;
  tensor *in_R9;
  float fVar11;
  double in_XMM0_Qa;
  double dVar12;
  double dVar13;
  double in_XMM1_Qa;
  tensor *in_stack_00000008;
  tensor *in_stack_00000010;
  long i_2;
  long n_1;
  float *p_beta;
  float *p_gamma;
  float *p_dest;
  float actual_var;
  long i_1;
  double scale;
  float *rvar;
  float val;
  long n;
  long i;
  long num;
  float *p_src;
  float *p_means;
  float *p_invstds;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  long in_stack_fffffffffffff518;
  resizable_tensor *in_stack_fffffffffffff520;
  long in_stack_fffffffffffff528;
  string *in_stack_fffffffffffff530;
  resizable_tensor *this_01;
  tensor *in_stack_fffffffffffff538;
  error_type eVar14;
  resizable_tensor *in_stack_fffffffffffff540;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
  *item_00;
  resizable_tensor *in_stack_fffffffffffff5b8;
  resizable_tensor *in_stack_fffffffffffff5c0;
  long local_750;
  long local_748;
  float *local_730;
  long local_720;
  long local_700;
  long local_6f8;
  float *local_6e8;
  ostream local_6a8;
  undefined1 local_529;
  ostream local_508;
  undefined1 local_389;
  ostream local_368;
  undefined1 local_1e9;
  ostream local_1b8;
  tensor *local_40;
  long *local_38;
  double local_28;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
  *local_20;
  resizable_tensor *local_18;
  long *local_10;
  double local_8;
  
  local_28 = in_XMM1_Qa;
  if ((in_XMM1_Qa < 0.0) || (1.0 < in_XMM1_Qa)) {
    dlib_assert_breakpoint();
    eVar14 = (error_type)((ulong)in_stack_fffffffffffff538 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    poVar4 = std::operator<<(&local_1b8,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d1);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_1b8,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_1b8,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<(&local_1b8,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,"0 <= averaging_factor && averaging_factor <= 1");
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(&local_1b8,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"averaging_factor: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"\n");
    local_1e9 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff540,eVar14,in_stack_fffffffffffff530);
    local_1e9 = 0;
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  local_40 = in_R9;
  local_38 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  if (((in_XMM1_Qa != 1.0) || (NAN(in_XMM1_Qa))) &&
     (bVar1 = have_same_dimensions
                        (&in_stack_fffffffffffff540->super_tensor,in_stack_fffffffffffff538), !bVar1
     )) {
    dlib_assert_breakpoint();
    eVar14 = (error_type)((ulong)in_stack_fffffffffffff538 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
    poVar4 = std::operator<<(&local_368,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d2);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_368,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_368,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<(&local_368,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,
                             "averaging_factor==1 || have_same_dimensions(running_means,means)");
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(&local_368,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"");
    std::operator<<(poVar4,"\n");
    local_389 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff540,eVar14,in_stack_fffffffffffff530);
    local_389 = 0;
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (((local_28 != 1.0) || (NAN(local_28))) &&
     (bVar1 = have_same_dimensions
                        (&in_stack_fffffffffffff540->super_tensor,in_stack_fffffffffffff538), !bVar1
     )) {
    dlib_assert_breakpoint();
    eVar14 = (error_type)((ulong)in_stack_fffffffffffff538 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_508);
    poVar4 = std::operator<<(&local_508,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d3);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_508,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(&local_508,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<(&local_508,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,
                             "averaging_factor==1 || have_same_dimensions(running_variances,invstds)"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(&local_508,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"");
    std::operator<<(poVar4,"\n");
    local_529 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff540,eVar14,in_stack_fffffffffffff530);
    local_529 = 0;
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar6 = tensor::num_samples(local_40);
  if (((1 < lVar6) && (lVar6 = tensor::num_samples(in_stack_00000008), lVar6 == 1)) &&
     (lVar6 = tensor::num_samples(in_stack_00000010), lVar6 == 1)) {
    lVar6 = tensor::nr(in_stack_00000008);
    lVar7 = tensor::nr(in_stack_00000010);
    if (lVar6 == lVar7) {
      lVar6 = tensor::nr(in_stack_00000010);
      lVar7 = tensor::nr(local_40);
      if (lVar6 == lVar7) {
        lVar6 = tensor::nc(in_stack_00000008);
        lVar7 = tensor::nc(in_stack_00000010);
        if (lVar6 == lVar7) {
          lVar6 = tensor::nc(in_stack_00000010);
          lVar7 = tensor::nc(local_40);
          if (lVar6 == lVar7) {
            lVar6 = tensor::k(in_stack_00000008);
            lVar7 = tensor::k(in_stack_00000010);
            if (lVar6 == lVar7) {
              lVar6 = tensor::k(in_stack_00000010);
              lVar7 = tensor::k(local_40);
              if ((lVar6 == lVar7) && (0.0 < local_8)) {
                resizable_tensor::copy_size(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
                this_01 = local_18;
                item = (tensor *)tensor::k(local_40);
                this = (resizable_tensor *)tensor::nr(local_40);
                tensor::nc(local_40);
                resizable_tensor::set_size
                          (this_01,in_stack_fffffffffffff528,(long)in_stack_fffffffffffff520,
                           in_stack_fffffffffffff518,0x373c46);
                item_00 = local_20;
                this_00 = (resizable_tensor *)tensor::k(local_40);
                tensor::nr(local_40);
                tensor::nc(local_40);
                resizable_tensor::set_size
                          (this_01,in_stack_fffffffffffff528,(long)in_stack_fffffffffffff520,
                           in_stack_fffffffffffff518,0x373ca0);
                resizable_tensor::operator=
                          (in_stack_fffffffffffff520,
                           (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
                resizable_tensor::operator=
                          (in_stack_fffffffffffff520,
                           (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
                lVar6 = (**(code **)(*(long *)local_20 + 0x18))();
                iVar2 = (*(local_18->super_tensor)._vptr_tensor[3])();
                lVar7 = CONCAT44(extraout_var,iVar2);
                iVar2 = (*local_40->_vptr_tensor[2])();
                lVar8 = tensor::k(local_40);
                lVar9 = tensor::nr(local_40);
                lVar10 = tensor::nc(local_40);
                lVar10 = lVar8 * lVar9 * lVar10;
                for (local_6f8 = 0; fVar11 = (float)((ulong)in_stack_fffffffffffff518 >> 0x20),
                    local_6f8 < lVar10; local_6f8 = local_6f8 + 1) {
                  local_700 = 0;
                  while (lVar8 = local_700, lVar9 = tensor::num_samples(local_40), lVar8 < lVar9) {
                    fVar11 = *(float *)(CONCAT44(extraout_var_00,iVar2) +
                                       (local_700 * lVar10 + local_6f8) * 4);
                    *(float *)(lVar7 + local_6f8 * 4) = fVar11 + *(float *)(lVar7 + local_6f8 * 4);
                    *(float *)(lVar6 + local_6f8 * 4) =
                         fVar11 * fVar11 + *(float *)(lVar6 + local_6f8 * 4);
                    local_700 = local_700 + 1;
                  }
                }
                tensor::num_samples(local_40);
                tensor::operator/=(&in_stack_fffffffffffff520->super_tensor,fVar11);
                tensor::num_samples(local_40);
                tensor::operator/=(&in_stack_fffffffffffff520->super_tensor,fVar11);
                (**(code **)(*(long *)local_20 + 0x18))();
                (*(local_18->super_tensor)._vptr_tensor[3])();
                resizable_tensor::copy_size(this,item);
                lVar8 = (**(code **)(*local_38 + 0x18))();
                lVar9 = tensor::num_samples(local_40);
                dVar12 = (double)lVar9;
                lVar9 = tensor::num_samples(local_40);
                dVar12 = dVar12 / ((double)lVar9 - 1.0);
                for (local_720 = 0; local_720 < lVar10; local_720 = local_720 + 1) {
                  fVar11 = -*(float *)(lVar7 + local_720 * 4) * *(float *)(lVar7 + local_720 * 4) +
                           *(float *)(lVar6 + local_720 * 4);
                  if ((local_28 != 1.0) || (NAN(local_28))) {
                    *(float *)(lVar8 + local_720 * 4) =
                         (float)((1.0 - local_28) * (double)*(float *)(lVar8 + local_720 * 4) +
                                dVar12 * local_28 * (double)fVar11);
                  }
                  else {
                    *(float *)(lVar8 + local_720 * 4) = (float)(dVar12 * (double)fVar11);
                  }
                  dVar13 = sqrt((double)fVar11 + local_8);
                  *(float *)(lVar6 + local_720 * 4) = (float)(1.0 / dVar13);
                }
                iVar2 = (*local_40->_vptr_tensor[2])();
                local_6e8 = (float *)CONCAT44(extraout_var_01,iVar2);
                local_730 = (float *)(**(code **)(*local_10 + 0x18))();
                iVar2 = (*in_stack_00000008->_vptr_tensor[2])();
                iVar3 = (*in_stack_00000010->_vptr_tensor[2])();
                local_748 = 0;
                while (lVar8 = local_748, lVar9 = tensor::num_samples(local_40), lVar8 < lVar9) {
                  for (local_750 = 0; local_750 < lVar10; local_750 = local_750 + 1) {
                    *local_730 = (*local_6e8 - *(float *)(lVar7 + local_750 * 4)) *
                                 *(float *)(lVar6 + local_750 * 4);
                    *local_730 = *local_730 *
                                 *(float *)(CONCAT44(extraout_var_02,iVar2) + local_750 * 4) +
                                 *(float *)(CONCAT44(extraout_var_03,iVar3) + local_750 * 4);
                    local_6e8 = local_6e8 + 1;
                    local_730 = local_730 + 1;
                  }
                  local_748 = local_748 + 1;
                }
                resizable_tensor::copy_size(this,item);
                if ((local_28 != 1.0) || (NAN(local_28))) {
                  mat(item);
                  dlib::operator*((double *)item,
                                  (matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                                  this_01);
                  mat(item);
                  dlib::operator*((double *)item,
                                  (matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                                  this_01);
                  dlib::operator+((matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                                   *)item,(matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                                           *)this_01);
                  resizable_tensor::operator=(this_00,item_00);
                }
                else {
                  resizable_tensor::operator=(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  eVar14 = (error_type)((ulong)in_stack_fffffffffffff538 >> 0x20);
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
  poVar4 = std::operator<<(&local_6a8,"\n\nError detected at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e8);
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<(&local_6a8,"Error detected in file ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<(&local_6a8,"Error detected in function ");
  poVar4 = std::operator<<(poVar4,
                           "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar4,".\n\n");
  poVar4 = std::operator<<(&local_6a8,"Failing expression was ");
  poVar4 = std::operator<<(poVar4,
                           "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == beta.nr() && beta.nr() == src.nr() && gamma.nc() == beta.nc() && beta.nc() == src.nc() && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
                          );
  std::operator<<(poVar4,".\n");
  poVar4 = (ostream *)std::ostream::operator<<(&local_6a8,std::boolalpha);
  poVar4 = std::operator<<(poVar4,"\ngamma.num_samples(): ");
  lVar6 = tensor::num_samples(in_stack_00000008);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\ngamma.k():  ");
  lVar6 = tensor::k(in_stack_00000008);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\ngamma.nr(): ");
  lVar6 = tensor::nr(in_stack_00000008);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\ngamma.nc(): ");
  lVar6 = tensor::nc(in_stack_00000008);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nbeta.num_samples(): ");
  lVar6 = tensor::num_samples(in_stack_00000010);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nbeta.k():   ");
  lVar6 = tensor::k(in_stack_00000010);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nbeta.nr():  ");
  lVar6 = tensor::nr(in_stack_00000010);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nbeta.nc():  ");
  lVar6 = tensor::nc(in_stack_00000010);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nsrc.k():   ");
  lVar6 = tensor::k(local_40);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nsrc.nr():  ");
  lVar6 = tensor::nr(local_40);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\nsrc.nc():  ");
  lVar6 = tensor::nc(local_40);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6);
  poVar4 = std::operator<<(poVar4,"\neps:  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8);
  std::operator<<(poVar4,"\n");
  uVar5 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error
            ((fatal_error *)in_stack_fffffffffffff540,eVar14,in_stack_fffffffffffff530);
  __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void batch_normalize (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == beta.nr() && beta.nr() == src.nr() &&
                gamma.nc() == beta.nc() && beta.nc() == src.nc() &&
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k(), src.nr(), src.nc());
            invstds.set_size(1, src.k(), src.nr(), src.nc());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            auto p_src = src.host();
            const long num = src.k()*src.nr()*src.nc();
            // compute means, and sum of squares
            for (long i = 0; i < num; ++i)
            {
                for (long n = 0; n < src.num_samples(); ++n)
                {
                    float val = p_src[n*num+i];
                    p_means[i] += val;
                    p_invstds[i] += val*val;
                }
            }
            means /= src.num_samples();
            invstds /= src.num_samples();
            // copy data back to host
            invstds.host(); means.host();

            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples())/(src.num_samples()-1.0);
            for (long i = 0; i < num; ++i)
            {
                auto actual_var = p_invstds[i] - p_means[i]*p_means[i];
                if (averaging_factor == 1)
                    rvar[i] = scale*actual_var;
                else
                    rvar[i] = (1-averaging_factor)*rvar[i] + scale*averaging_factor*actual_var;

                p_invstds[i] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    *p_dest = (*p_src - p_means[i])*p_invstds[i];
                    *p_dest = (*p_dest)*p_gamma[i] + p_beta[i];
                    ++p_src;
                    ++p_dest;
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }